

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int AddVidModeToList(VideoModeList *vmode,SDL12_Rect *mode,Uint16 maxw,Uint16 maxh)

{
  uint uVar1;
  int iVar2;
  SDL12_Rect *pSVar3;
  ulong uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  
  if ((((int)CONCAT62(in_register_00000012,maxw) == 0) || (mode->w <= maxw)) &&
     ((maxh == 0 || (mode->h <= maxh)))) {
    uVar1 = vmode->nummodes;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if ((vmode->modeslist12[uVar4].w == mode->w) && (vmode->modeslist12[uVar4].h == mode->h)) {
        return 0;
      }
    }
    pSVar3 = (SDL12_Rect *)(*SDL20_realloc)(vmode->modeslist12,(long)(int)uVar1 * 8 + 8);
    if (pSVar3 == (SDL12_Rect *)0x0) {
      iVar2 = (*SDL20_Error)(SDL_ENOMEM);
      return iVar2;
    }
    vmode->modeslist12 = pSVar3;
    (*SDL20_memcpy)(pSVar3 + vmode->nummodes,mode,8);
    vmode->nummodes = vmode->nummodes + 1;
  }
  return 0;
}

Assistant:

static int
AddVidModeToList(VideoModeList *vmode, SDL12_Rect *mode, const Uint16 maxw, const Uint16 maxh)
{
    void *ptr = NULL;
    int i;

    if ( (maxw && (mode->w > maxw)) || (maxh && (mode->h > maxh)) ) {
        return 0;   /* clamp this one out as too big. */
    }

    /* make sure we don't have this one already (with a different refresh rate, etc). */
    for (i = 0; i < vmode->nummodes; i++) {
        if ((vmode->modeslist12[i].w == mode->w) && (vmode->modeslist12[i].h == mode->h)) {
            break;
        }
    }

    if (i < vmode->nummodes) {
        return 0;  /* already have this one. */
    }

    ptr = SDL20_realloc(vmode->modeslist12, sizeof (SDL12_Rect) * (vmode->nummodes + 1));
    if (ptr == NULL) {
        return SDL20_OutOfMemory();
    }
    vmode->modeslist12 = (SDL12_Rect *) ptr;

    SDL20_memcpy(&vmode->modeslist12[vmode->nummodes], mode, sizeof(vmode->modeslist12[vmode->nummodes]));
    vmode->nummodes++;

    return 0;
}